

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

char * cJSON_PrintBuffered(cJSON *item,int prebuffer,cJSON_bool fmt)

{
  cJSON_bool cVar1;
  long in_FS_OFFSET;
  cJSON_bool fmt_local;
  int prebuffer_local;
  cJSON *item_local;
  undefined1 local_50 [8];
  printbuffer p;
  
  p.hooks.reallocate = *(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28);
  memset(local_50,0,0x40);
  if (prebuffer < 0) {
    item_local = (cJSON *)0x0;
  }
  else {
    local_50 = (undefined1  [8])(*global_hooks.allocate)((long)prebuffer);
    if (local_50 == (undefined1  [8])0x0) {
      item_local = (cJSON *)0x0;
    }
    else {
      p.buffer = (uchar *)(long)prebuffer;
      p.length = 0;
      p.depth._0_4_ = 0;
      p._32_8_ = global_hooks.allocate;
      p.hooks.allocate = (_func_void_ptr_size_t *)global_hooks.deallocate;
      p.hooks.deallocate = (_func_void_void_ptr *)global_hooks.reallocate;
      p.depth._4_4_ = fmt;
      cVar1 = print_value(item,(printbuffer *)local_50);
      if (cVar1 == 0) {
        (*global_hooks.deallocate)((void *)local_50);
        item_local = (cJSON *)0x0;
      }
      else {
        item_local = (cJSON *)local_50;
      }
    }
  }
  if (*(_func_void_ptr_void_ptr_size_t **)(in_FS_OFFSET + 0x28) == p.hooks.reallocate) {
    return (char *)item_local;
  }
  __stack_chk_fail();
}

Assistant:

CJSON_PUBLIC(char *) cJSON_PrintBuffered(const cJSON *item, int prebuffer, cJSON_bool fmt)
{
    printbuffer p = { 0, 0, 0, 0, 0, 0, { 0, 0, 0 } };

    if (prebuffer < 0)
    {
        return NULL;
    }

    p.buffer = (unsigned char*)global_hooks.allocate((size_t)prebuffer);
    if (!p.buffer)
    {
        return NULL;
    }

    p.length = (size_t)prebuffer;
    p.offset = 0;
    p.noalloc = false;
    p.format = fmt;
    p.hooks = global_hooks;

    if (!print_value(item, &p))
    {
        global_hooks.deallocate(p.buffer);
        return NULL;
    }

    return (char*)p.buffer;
}